

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadThreadsGraph.cc
# Opt level: O0

bool __thiscall
ReadThreadsGraph::add_thread
          (ReadThreadsGraph *this,int64_t thread_id,
          vector<NodePosition,_std::allocator<NodePosition>_> *node_positions,bool remove_duplicated
          ,int min_thread_nodes)

{
  Support support;
  uint16_t uVar1;
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  const_reference pvVar5;
  size_type sVar6;
  long lVar7;
  mapped_type *pmVar8;
  byte in_CL;
  vector<NodePosition,_std::allocator<NodePosition>_> *in_RDX;
  int64_t in_RSI;
  DistanceGraph *in_RDI;
  int in_R8D;
  pair<std::__detail::_Node_iterator<long,_true,_false>,_bool> pVar9;
  sgNodeID_t end2;
  int32_t i;
  sgNodeID_t end1;
  int32_t last_valid_i;
  uint16_t lidx;
  NodePosition *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<NodePosition,_std::allocator<NodePosition>_> *__range2;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> duplicated;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> seen;
  vector<NodePosition,_std::allocator<NodePosition>_> *in_stack_fffffffffffffe38;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  *in_stack_fffffffffffffe50;
  int32_t in_stack_fffffffffffffe8c;
  _Node_iterator_base<long,_false> in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea8;
  sgNodeID_t sVar10;
  int64_t in_stack_fffffffffffffeb0;
  Support local_138;
  long local_128;
  int local_11c;
  sgNodeID_t local_118;
  int local_110;
  uint16_t local_10a;
  _Node_iterator_base<long,_false> local_108;
  undefined1 local_100;
  long local_f8;
  _Node_iterator_base<long,_false> local_f0;
  undefined1 local_e8;
  long local_e0;
  long local_c8;
  reference local_c0;
  NodePosition *local_b8;
  __normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
  local_b0;
  vector<NodePosition,_std::allocator<NodePosition>_> *local_a8;
  undefined4 local_9c;
  int local_28;
  byte local_21;
  vector<NodePosition,_std::allocator<NodePosition>_> *local_20;
  int64_t local_18;
  byte local_1;
  
  local_21 = in_CL & 1;
  local_28 = in_R8D;
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                0x50cc8c);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *)
                0x50cc99);
  sVar3 = std::vector<NodePosition,_std::allocator<NodePosition>_>::size(local_20);
  if (sVar3 < (ulong)(long)local_28) {
    local_1 = 0;
  }
  else {
    if ((local_21 & 1) != 0) {
      std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::clear
                ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )0x50cce6);
      std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::clear
                ((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )0x50ccf3);
      local_a8 = local_20;
      local_b0._M_current =
           (NodePosition *)
           std::vector<NodePosition,_std::allocator<NodePosition>_>::begin
                     (in_stack_fffffffffffffe38);
      local_b8 = (NodePosition *)
                 std::vector<NodePosition,_std::allocator<NodePosition>_>::end
                           (in_stack_fffffffffffffe38);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
                                 *)in_stack_fffffffffffffe40,
                                (__normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
                                 *)in_stack_fffffffffffffe38), bVar2) {
        local_c0 = __gnu_cxx::
                   __normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
                   ::operator*(&local_b0);
        local_c8 = local_c0->node;
        if (local_c8 < 1) {
          local_c8 = -local_c8;
        }
        in_stack_fffffffffffffe98 =
             std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
             count(in_stack_fffffffffffffe40,(key_type *)in_stack_fffffffffffffe38);
        if (in_stack_fffffffffffffe98 == 0) {
          local_f8 = local_c0->node;
          if (local_f8 < 1) {
            local_f8 = -local_f8;
          }
          pVar9 = std::
                  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
                  insert(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          local_108._M_cur =
               (__node_type *)pVar9.first.super__Node_iterator_base<long,_false>._M_cur;
          local_100 = pVar9.second;
        }
        else {
          local_e0 = local_c0->node;
          if (local_e0 < 1) {
            local_e0 = -local_e0;
          }
          pVar9 = std::
                  unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
                  insert(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          in_stack_fffffffffffffe90._M_cur =
               (__node_type *)pVar9.first.super__Node_iterator_base<long,_false>._M_cur;
          local_e8 = pVar9.second;
          in_stack_fffffffffffffe8c = CONCAT13(local_e8,(int3)in_stack_fffffffffffffe8c);
          local_f0._M_cur = in_stack_fffffffffffffe90._M_cur;
        }
        __gnu_cxx::
        __normal_iterator<const_NodePosition_*,_std::vector<NodePosition,_std::allocator<NodePosition>_>_>
        ::operator++(&local_b0);
      }
    }
    local_10a = 0;
    local_110 = -1;
    for (local_11c = 0; uVar4 = (ulong)local_11c,
        sVar3 = std::vector<NodePosition,_std::allocator<NodePosition>_>::size(local_20),
        uVar4 < sVar3; local_11c = local_11c + 1) {
      bVar2 = false;
      if ((local_21 & 1) != 0) {
        pvVar5 = std::vector<NodePosition,_std::allocator<NodePosition>_>::operator[]
                           (local_20,(long)local_11c);
        local_128 = pvVar5->node;
        if (local_128 < 1) {
          local_128 = -local_128;
        }
        sVar6 = std::
                unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
                count(in_stack_fffffffffffffe40,(key_type *)in_stack_fffffffffffffe38);
        bVar2 = sVar6 != 0;
      }
      if (!bVar2) {
        if (local_110 == -1) {
          pvVar5 = std::vector<NodePosition,_std::allocator<NodePosition>_>::operator[]
                             (local_20,(long)local_11c);
          local_118 = pvVar5->node;
        }
        else {
          std::vector<NodePosition,_std::allocator<NodePosition>_>::operator[]
                    (local_20,(long)local_110);
          std::vector<NodePosition,_std::allocator<NodePosition>_>::operator[]
                    (local_20,(long)local_11c);
          std::vector<NodePosition,_std::allocator<NodePosition>_>::operator[]
                    (local_20,(long)local_11c);
          std::vector<NodePosition,_std::allocator<NodePosition>_>::operator[]
                    (local_20,(long)local_110);
          uVar1 = local_10a;
          local_10a = local_10a + 1;
          Support::Support(&local_138,LongRead,uVar1,local_18);
          support.id = in_stack_fffffffffffffeb0;
          support.type = (char)in_stack_fffffffffffffea8;
          support._1_1_ = (char)((ulong)in_stack_fffffffffffffea8 >> 8);
          support.index = (short)((ulong)in_stack_fffffffffffffea8 >> 0x10);
          support._4_4_ = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
          DistanceGraph::add_link
                    (in_RDI,in_stack_fffffffffffffe98,(sgNodeID_t)in_stack_fffffffffffffe90._M_cur,
                     in_stack_fffffffffffffe8c,support);
        }
        local_110 = local_11c;
      }
    }
    if (local_110 == -1) {
      local_1 = 0;
    }
    else {
      pvVar5 = std::vector<NodePosition,_std::allocator<NodePosition>_>::operator[]
                         (local_20,(long)local_110);
      uVar1 = local_10a;
      lVar7 = -pvVar5->node;
      sVar10 = local_118;
      pmVar8 = std::
               unordered_map<long,_ThreadInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_ThreadInfo>_>_>
               ::operator[]((unordered_map<long,_ThreadInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_ThreadInfo>_>_>
                             *)in_stack_fffffffffffffe40,(key_type *)in_stack_fffffffffffffe38);
      pmVar8->start = sVar10;
      pmVar8->end = lVar7;
      pmVar8->link_count = uVar1;
      local_1 = 1;
    }
  }
  local_9c = 1;
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )0x50d15a);
  std::unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>::
  ~unordered_set((unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_> *
                 )0x50d167);
  return (bool)(local_1 & 1);
}

Assistant:

bool ReadThreadsGraph::add_thread(int64_t thread_id, const std::vector<NodePosition> &node_positions, bool remove_duplicated, int min_thread_nodes) {
    std::unordered_set<sgNodeID_t> seen,duplicated;
    if (node_positions.size()<min_thread_nodes) return false;
    if (remove_duplicated) {
        seen.clear();
        duplicated.clear();
        for (const auto &p:node_positions){
            if (seen.count(llabs(p.node))) duplicated.insert(llabs(p.node));
            else seen.insert(llabs(p.node));
        }
    }
    uint16_t lidx=0;
    int32_t last_valid_i=-1;
    sgNodeID_t end1;
    for (int32_t i = 0; i < node_positions.size(); ++i) {
        if (remove_duplicated and  duplicated.count(llabs(node_positions[i].node))) continue;
        if (last_valid_i!=-1) {
            add_link(-node_positions[last_valid_i].node, node_positions[i].node,
                     node_positions[i].start - node_positions[last_valid_i].end,
                     {SupportType::LongRead, lidx++, thread_id});
        }
        else end1=node_positions[i].node;
        last_valid_i=i;
    }
    if (last_valid_i==-1) return false;
    sgNodeID_t end2=-node_positions[last_valid_i].node;
    thread_info[thread_id]={end1, end2, lidx};
    return true;
}